

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O3

void __thiscall cnn::ComputationGraph::PrintGraphviz(ComputationGraph *this)

{
  size_type *psVar1;
  ulong uVar2;
  uint __val;
  pointer pVVar3;
  bool bVar4;
  char cVar5;
  char cVar6;
  pointer ppNVar7;
  undefined8 *puVar8;
  ostream *poVar9;
  uint uVar10;
  ulong uVar11;
  pointer pVVar12;
  string __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  var_names;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  ulong local_a8;
  Node *local_a0;
  ulong *local_98;
  uint local_90;
  undefined4 uStack_8c;
  ulong local_88 [2];
  ulong *local_78;
  long local_70;
  ulong local_68 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  pointer local_40;
  pointer local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"digraph G {\n  rankdir=LR;\n  nodesep=.05;\n",0x29);
  local_40 = (this->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  ppNVar7 = (this->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppNVar7 != local_40) {
    local_a8 = 0;
    do {
      local_a0 = *ppNVar7;
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pVVar3 = (local_a0->args).
               super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_38 = ppNVar7;
      for (pVVar12 = (local_a0->args).
                     super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
                     _M_impl.super__Vector_impl_data._M_start; pVVar12 != pVVar3;
          pVVar12 = pVVar12 + 1) {
        __val = pVVar12->t;
        local_78 = local_68;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"v","");
        cVar6 = '\x01';
        if (9 < __val) {
          uVar10 = __val;
          cVar5 = '\x04';
          do {
            cVar6 = cVar5;
            if (uVar10 < 100) {
              cVar6 = cVar6 + -2;
              goto LAB_0016dd79;
            }
            if (uVar10 < 1000) {
              cVar6 = cVar6 + -1;
              goto LAB_0016dd79;
            }
            if (uVar10 < 10000) goto LAB_0016dd79;
            bVar4 = 99999 < uVar10;
            uVar10 = uVar10 / 10000;
            cVar5 = cVar6 + '\x04';
          } while (bVar4);
          cVar6 = cVar6 + '\x01';
        }
LAB_0016dd79:
        local_98 = local_88;
        std::__cxx11::string::_M_construct((ulong)&local_98,cVar6);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_98,local_90,__val);
        uVar11 = 0xf;
        if (local_78 != local_68) {
          uVar11 = local_68[0];
        }
        uVar2 = CONCAT44(uStack_8c,local_90) + local_70;
        if (uVar11 < uVar2) {
          uVar11 = 0xf;
          if (local_98 != local_88) {
            uVar11 = local_88[0];
          }
          if (uVar11 < uVar2) goto LAB_0016dddd;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_78);
        }
        else {
LAB_0016dddd:
          puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_98);
        }
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        psVar1 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_c8.field_2._M_allocated_capacity = *psVar1;
          local_c8.field_2._8_8_ = puVar8[3];
        }
        else {
          local_c8.field_2._M_allocated_capacity = *psVar1;
          local_c8._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_c8._M_string_length = puVar8[1];
        *puVar8 = psVar1;
        puVar8[1] = 0;
        *(undefined1 *)psVar1 = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58,
                   &local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p);
        }
        if (local_98 != local_88) {
          operator_delete(local_98);
        }
        if (local_78 != local_68) {
          operator_delete(local_78);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"  N",3);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," [label=\"v",10);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," = ",3);
      (*local_a0->_vptr_Node[3])(&local_c8,local_a0,&local_58);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_c8._M_dataplus._M_p,local_c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"];\n",4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      pVVar3 = (local_a0->args).
               super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pVVar12 = (local_a0->args).
                     super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
                     _M_impl.super__Vector_impl_data._M_start; pVVar12 != pVVar3;
          pVVar12 = pVVar12 + 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"  N",3);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," -> N",5);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
      }
      local_a8 = (ulong)((int)local_a8 + 1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_58);
      ppNVar7 = local_38 + 1;
    } while (ppNVar7 != local_40);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"}\n",2);
  return;
}

Assistant:

void ComputationGraph::PrintGraphviz() const {
  cerr << "digraph G {\n  rankdir=LR;\n  nodesep=.05;\n";
  unsigned nc = 0;
  for (auto node : nodes) {
    vector<string> var_names;
    for (auto arg : node->args)
      var_names.push_back(string("v") + to_string((unsigned)arg));
    cerr << "  N" << nc << " [label=\"v" << nc << " = "
         << node->as_string(var_names) << "\"];\n";
    for (auto arg : node->args)
      cerr << "  N" << ((unsigned)arg) << " -> N" << nc << ";\n";
    ++nc;
  }
  cerr << "}\n";
}